

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HammeringPattern.cpp
# Opt level: O3

AggressorAccessPattern * __thiscall
HammeringPattern::get_access_pattern_by_aggressor(HammeringPattern *this,Aggressor *agg)

{
  AggressorAccessPattern *pAVar1;
  AggressorAccessPattern *aap;
  AggressorAccessPattern *pAVar2;
  string local_60;
  string local_40;
  
  pAVar2 = (this->agg_access_patterns).
           super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (this->agg_access_patterns).
           super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pAVar2 != pAVar1) {
    do {
      if (((pAVar2->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
           super__Vector_impl_data._M_start)->id == agg->id) {
        return pAVar2;
      }
      pAVar2 = pAVar2 + 1;
    } while (pAVar2 != pAVar1);
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "Could not find AggressorAccessPattern whose first aggressor has id %s.","");
  format_string<int>(&local_60,&local_40,agg->id);
  Logger::log_error(&local_60,true);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  exit(1);
}

Assistant:

AggressorAccessPattern &HammeringPattern::get_access_pattern_by_aggressor(Aggressor &agg) {
  // iterate over the AggressorAccessPatterns and return the *first* AggressorAccessPattern that has the given Aggressor
  // agg as its *first* Aggressor
  for (auto &aap : agg_access_patterns) {
    if (aap.aggressors[0].id==agg.id) return aap;
  }
  Logger::log_error(format_string("Could not find AggressorAccessPattern whose first aggressor has id %s.", agg.id));
  exit(1);
}